

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O3

void __thiscall rw::Geometry::correctTristripWinding(Geometry *this)

{
  void *pvVar1;
  short sVar2;
  undefined2 uVar3;
  MeshHeader *pMVar4;
  long lVar5;
  uint16 uVar6;
  uint16 uVar7;
  MeshHeader *pMVar8;
  void *__src;
  MeshHeader *pMVar9;
  MeshHeader *pMVar10;
  uint uVar11;
  short sVar12;
  ushort uVar13;
  uint uVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  bool bVar19;
  
  pMVar4 = this->meshHeader;
  if ((pMVar4 == (MeshHeader *)0x0 || (this->flags & 0x1000000) != 0) || (pMVar4->flags != 1)) {
    return;
  }
  this->meshHeader = (MeshHeader *)0x0;
  pMVar8 = allocateMeshes(this,(uint)pMVar4->numMeshes,0,1);
  pMVar8->flags = pMVar4->flags;
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/geometry.cpp line: 581"
  ;
  __src = (void *)(*DAT_00149858)((ulong)(pMVar4->totalIndices * 2) * 2);
  if (pMVar4->numMeshes != 0) {
    pMVar9 = pMVar8 + 1;
    pMVar10 = pMVar4 + 1;
    uVar11 = pMVar8->totalIndices;
    uVar13 = 0;
    do {
      pMVar9->totalIndices = 0;
      pvVar1 = (void *)((long)__src + (ulong)uVar11 * 2);
      *(void **)pMVar9 = pvVar1;
      uVar6 = pMVar10[1].numMeshes;
      uVar7 = pMVar10[1].serialNum;
      pMVar9[1].flags = pMVar10[1].flags;
      pMVar9[1].numMeshes = uVar6;
      pMVar9[1].serialNum = uVar7;
      if (pMVar10->totalIndices == 2) {
        uVar17 = 0;
        uVar15 = 0;
LAB_0010bda9:
        lVar5 = *(long *)pMVar10;
        uVar17 = uVar17 & 0xffffffff;
        do {
          uVar16 = (ulong)uVar15;
          uVar3 = *(undefined2 *)(lVar5 + uVar17 * 2);
          uVar15 = uVar15 + 1;
          pMVar9->totalIndices = uVar15;
          *(undefined2 *)((long)pvVar1 + uVar16 * 2) = uVar3;
          uVar17 = uVar17 + 1;
        } while (uVar17 < pMVar10->totalIndices);
      }
      else {
        lVar5 = *(long *)pMVar10;
        uVar16 = 0;
        uVar17 = 0;
        bVar18 = false;
        do {
          uVar14 = (uint)uVar16;
          sVar12 = *(short *)(lVar5 + uVar17 * 2);
          sVar2 = *(short *)(lVar5 + 2 + uVar17 * 2);
          if (sVar12 == sVar2) {
            bVar18 = false;
          }
          else {
            bVar19 = sVar2 != *(short *)(lVar5 + (ulong)((int)uVar17 + 2) * 2);
            if (bVar19 && !bVar18) {
              bVar18 = true;
              if ((uVar16 & 1) != 0) {
                *(undefined2 *)((long)pvVar1 + uVar16 * 2) =
                     *(undefined2 *)((long)pvVar1 + (ulong)(uVar14 - 1) * 2);
                uVar14 = uVar14 + 1;
                sVar12 = *(short *)(lVar5 + uVar17 * 2);
              }
            }
            else {
              bVar18 = (bool)(bVar19 & bVar18);
            }
          }
          uVar17 = uVar17 + 1;
          uVar15 = uVar14 + 1;
          uVar16 = (ulong)uVar15;
          pMVar9->totalIndices = uVar15;
          *(short *)((long)pvVar1 + (ulong)uVar14 * 2) = sVar12;
        } while (uVar17 < pMVar10->totalIndices - 2);
        if ((uint)uVar17 < pMVar10->totalIndices) goto LAB_0010bda9;
      }
      uVar11 = uVar11 + uVar15;
      pMVar10 = (MeshHeader *)&pMVar10[1].totalIndices;
      pMVar9 = (MeshHeader *)&pMVar9[1].totalIndices;
      uVar13 = uVar13 + 1;
    } while (uVar13 < pMVar4->numMeshes);
    pMVar8->totalIndices = uVar11;
  }
  (*DAT_00149850)(pMVar4);
  allocateMeshes(this,(uint)pMVar8->numMeshes,pMVar8->totalIndices,0);
  memcpy(*(void **)(this->meshHeader + 1),__src,(ulong)(this->meshHeader->totalIndices * 2));
  (*DAT_00149850)(__src);
  return;
}

Assistant:

void
Geometry::correctTristripWinding(void)
{
	MeshHeader *header = this->meshHeader;
	if(this->flags & NATIVE || header == nil ||
	   header->flags != MeshHeader::TRISTRIP)
		return;
	this->meshHeader = nil;
	// Allocate no indices, we realloc later
	MeshHeader *newhead = this->allocateMeshes(header->numMeshes, 0, 1);
	newhead->flags = header->flags;
	/* get a temporary working buffer */
	uint16 *indices = rwNewT(uint16, header->totalIndices*2,
		MEMDUR_FUNCTION | ID_GEOMETRY);

	Mesh *mesh = header->getMeshes();
	Mesh *newmesh = newhead->getMeshes();
	for(uint16 i = 0; i < header->numMeshes; i++){
		newmesh->numIndices = 0;
		newmesh->indices = &indices[newhead->totalIndices];
		newmesh->material = mesh->material;

		bool inStrip = 0;
		uint32 j;
		for(j = 0; j < mesh->numIndices-2; j++){
			/* Duplicate vertices indicate end of strip */
			if(mesh->indices[j] == mesh->indices[j+1] ||
			   mesh->indices[j+1] == mesh->indices[j+2])
				inStrip = 0;
			else if(!inStrip){
				/* Entering strip now,
				 * make sure winding is correct */
				inStrip = 1;
				if(newmesh->numIndices % 2){
					newmesh->indices[newmesh->numIndices] =
					  newmesh->indices[newmesh->numIndices-1];
					newmesh->numIndices++;
				}
			}
			newmesh->indices[newmesh->numIndices++] = mesh->indices[j];
		}
		for(; j < mesh->numIndices; j++)
			newmesh->indices[newmesh->numIndices++] = mesh->indices[j];
		newhead->totalIndices += newmesh->numIndices;

		mesh++;
		newmesh++;
	}
	rwFree(header);
	// Now allocate indices and copy them
	this->allocateMeshes(newhead->numMeshes, newhead->totalIndices, 0);
	memcpy(this->meshHeader->getMeshes()->indices, indices, this->meshHeader->totalIndices*2);
	rwFree(indices);
}